

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_CreatePegInAddress1_Test::TestBody
          (ElementsAddressFactory_CreatePegInAddress1_Test *this)

{
  bool bVar1;
  Address address_1;
  ElementsAddressFactory factory_1;
  Address address;
  ElementsAddressFactory factory;
  Script fedpegscript;
  Pubkey pubkey;
  Address *this_00;
  AssertHelper local_420;
  Message local_418 [4];
  NetType in_stack_fffffffffffffc0c;
  ElementsAddressFactory *in_stack_fffffffffffffc10;
  Script *in_stack_fffffffffffffc30;
  Pubkey *in_stack_fffffffffffffc38;
  AddressType in_stack_fffffffffffffc44;
  ElementsAddressFactory *in_stack_fffffffffffffc48;
  AssertHelper local_270;
  Message local_268 [54];
  undefined1 local_b1 [145];
  Pubkey local_20;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_b1 + 0x71),
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             (allocator *)((long)local_b1 + 0x70));
  cfd::core::Pubkey::Pubkey(&local_20,(string *)(local_b1 + 0x71));
  std::__cxx11::string::~string((string *)(local_b1 + 0x71));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_b1 + 0x70));
  this_00 = (Address *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_b1 + 1),
             "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae"
             ,(allocator *)this_00);
  cfd::core::Script::Script((Script *)((long)local_b1 + 0x21),(string *)((long)local_b1 + 1));
  std::__cxx11::string::~string((string *)((long)local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                 in_stack_fffffffffffffc30);
      cfd::core::Address::~Address(this_00);
    }
  }
  else {
    testing::Message::Message(local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x106,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_270,local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x1f8e03);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f8e5b);
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::CreatePegInAddress
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                 in_stack_fffffffffffffc30);
      cfd::core::Address::~Address(this_00);
    }
  }
  else {
    testing::Message::Message(local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x10c,
               "Expected: Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message((Message *)0x1f8f92);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f8fe1);
  cfd::core::Script::~Script((Script *)this_00);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1f8ffb);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegInAddress1)
{
  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Script fedpegscript("522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae");
  {
    ElementsAddressFactory factory(NetType::kMainnet);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, Script()), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, Script()), CfdException);
  }
}